

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::SIMD128LowerReplaceLane_2(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint index;
  BOOL BVar3;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Opnd *this_01;
  Opnd *this_02;
  Opnd *this_03;
  Opnd *this_04;
  IntConstOpnd *pIVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  MemRefOpnd *pMVar7;
  
  this_00 = Simd128GetExtendedArgs(this,instr);
  this_01 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  this_02 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  this_03 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  this_04 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  pIVar4 = IR::Opnd::AsIntConstOpnd(this_03);
  index = IR::IntConstOpnd::AsInt32(pIVar4);
  bVar2 = IR::Opnd::IsSimd128(this_01);
  if (bVar2) {
    bVar2 = IR::Opnd::IsSimd128(this_02);
    if (!bVar2) goto LAB_005e9f36;
  }
  else {
LAB_005e9f36:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x206,"(dst->IsSimd128() && src1->IsSimd128())",
                       "dst->IsSimd128() && src1->IsSimd128()");
    if (!bVar2) goto LAB_005ea22d;
    *puVar5 = 0;
  }
  if (instr->m_opcode == Simd128_ReplaceLane_D2) {
    BVar3 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x20a,"(AutoSystemInfo::Data.SSE2Available())","SSE2 not supported");
      if (!bVar2) goto LAB_005ea22d;
      *puVar5 = 0;
    }
    if (this_04->m_type != TyFloat64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x20b,"(src3->IsFloat64())","src3->IsFloat64()");
      if (!bVar2) {
LAB_005ea22d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    Lowerer::InsertMove(this_01,this_02,instr,true);
    if (index == 0) {
      pIVar6 = IR::Instr::New(MOVSD,this_01,this_04,this->m_func);
    }
    else {
      pIVar4 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,true);
      pIVar6 = IR::Instr::New(SHUFPD,this_01,this_04,&pIVar4->super_Opnd,this->m_func);
    }
    IR::Instr::InsertBefore(instr,pIVar6);
  }
  else {
    bVar2 = IR::Opnd::IsInt64(this_04);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x218,"(src3->IsInt64())","src3->IsInt64()");
      if (!bVar2) goto LAB_005ea22d;
      *puVar5 = 0;
    }
    BVar3 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar3 == 0) {
      LoadHelperArgument(this,instr,this_03);
      LoadInt64HelperArgument(this,instr,this_04);
      pMVar7 = LoadSimdHelperArgument(this,instr,'\0');
      Lowerer::InsertMove(&pMVar7->super_Opnd,this_02,instr,true);
      pMVar7 = LoadSimdHelperArgument(this,instr,'\x01');
      pIVar6 = IR::Instr::New(CALL,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar6);
      ChangeToHelperCall(this,pIVar6,HelperSimd128ReplaceLaneI2,(LabelInstr *)0x0,(Opnd *)0x0,
                         (PropertySymOpnd *)0x0,false);
      Lowerer::InsertMove(this_01,&pMVar7->super_Opnd,instr,true);
    }
    else {
      Lowerer::InsertMove(this_01,this_02,instr,true);
      IR::Instr::SetDst(instr,this_01);
      EmitInsertInt64(this,this_04,index,instr);
    }
  }
  pIVar6 = removeInstr(instr);
  return pIVar6;
}

Assistant:

IR::Instr * LowererMD::SIMD128LowerReplaceLane_2(IR::Instr *instr)
{
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *src1 = args->Pop();
    IR::Opnd *src2 = args->Pop();
    IR::Opnd *src3 = args->Pop();

    int lane = src2->AsIntConstOpnd()->AsInt32();
    Assert(dst->IsSimd128() && src1->IsSimd128());

    if (instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_D2)
    {
        AssertMsg(AutoSystemInfo::Data.SSE2Available(), "SSE2 not supported");
        Assert(src3->IsFloat64());
        m_lowerer->InsertMove(dst, src1, instr);
        if (lane) 
        {
            instr->InsertBefore(IR::Instr::New(Js::OpCode::SHUFPD, dst, src3, IR::IntConstOpnd::New(0, TyInt8, m_func, true), m_func));
        }
        else 
        {
            instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, src3, m_func));
        }    
        return removeInstr(instr);
    }

    Assert(src3->IsInt64());

    if (AutoSystemInfo::Data.SSE4_1Available())
    {
        m_lowerer->InsertMove(dst, src1, instr);
        instr->SetDst(dst);
        EmitInsertInt64(src3, lane, instr);
    }
    else
    {
        LoadHelperArgument(instr, src2);
        LoadInt64HelperArgument(instr, src3);
        IR::MemRefOpnd* srcMemRef = LoadSimdHelperArgument(instr, 0);
        m_lowerer->InsertMove(srcMemRef, src1, instr);
        IR::MemRefOpnd* dstMemRef = LoadSimdHelperArgument(instr, 1);
        IR::Instr * helperCall = IR::Instr::New(Js::OpCode::CALL, this->m_func);
        instr->InsertBefore(helperCall);
        this->ChangeToHelperCall(helperCall, IR::HelperSimd128ReplaceLaneI2);
        m_lowerer->InsertMove(dst, dstMemRef, instr);
    }
    return removeInstr(instr);
}